

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_context.h
# Opt level: O1

char * __thiscall
google::protobuf::internal::EpsCopyInputStream::InitFrom(EpsCopyInputStream *this,string_view flat)

{
  char *__src;
  char *pcVar1;
  ulong __n;
  
  __src = flat._M_str;
  __n = flat._M_len;
  this->overall_limit_ = 0;
  if (__n < 0x11) {
    if (__n != 0) {
      memcpy(this->patch_buffer_,__src,__n);
    }
    this->limit_ = 0;
    pcVar1 = this->patch_buffer_;
    this->buffer_end_ = this->patch_buffer_ + __n;
    this->limit_end_ = this->patch_buffer_ + __n;
    this->next_chunk_ = (char *)0x0;
    if (this->aliasing_ == 1) {
      this->aliasing_ = (long)__src - (long)pcVar1;
    }
  }
  else {
    this->limit_ = 0x10;
    this->buffer_end_ = __src + (__n - 0x10);
    this->limit_end_ = __src + (__n - 0x10);
    this->next_chunk_ = this->patch_buffer_;
    pcVar1 = __src;
    if (this->aliasing_ == 1) {
      this->aliasing_ = 2;
    }
  }
  return pcVar1;
}

Assistant:

const char* InitFrom(absl::string_view flat) {
    overall_limit_ = 0;
    if (flat.size() > kSlopBytes) {
      limit_ = kSlopBytes;
      limit_end_ = buffer_end_ = flat.data() + flat.size() - kSlopBytes;
      next_chunk_ = patch_buffer_;
      if (aliasing_ == kOnPatch) aliasing_ = kNoDelta;
      return flat.data();
    } else {
      if (!flat.empty()) {
        std::memcpy(patch_buffer_, flat.data(), flat.size());
      }
      limit_ = 0;
      limit_end_ = buffer_end_ = patch_buffer_ + flat.size();
      next_chunk_ = nullptr;
      if (aliasing_ == kOnPatch) {
        aliasing_ = reinterpret_cast<std::uintptr_t>(flat.data()) -
                    reinterpret_cast<std::uintptr_t>(patch_buffer_);
      }
      return patch_buffer_;
    }
  }